

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void __thiscall
testing::anon_unknown_18::BetweenCardinalityImpl::BetweenCardinalityImpl
          (BetweenCardinalityImpl *this,int min,int max)

{
  ostream *poVar1;
  ostream *file;
  int in_EDX;
  int in_ESI;
  CardinalityInterface *in_RDI;
  stringstream ss;
  string *in_stack_fffffffffffffd78;
  undefined8 in_stack_fffffffffffffd80;
  int iVar2;
  char *in_stack_fffffffffffffd88;
  undefined8 in_stack_fffffffffffffd90;
  undefined1 uVar3;
  int local_22c;
  int local_21c;
  string local_208 [32];
  string local_1e8 [32];
  string local_1c8 [48];
  stringstream local_198 [16];
  ostream local_188 [376];
  int local_10;
  int local_c;
  
  uVar3 = (undefined1)((ulong)in_stack_fffffffffffffd90 >> 0x38);
  iVar2 = (int)((ulong)in_stack_fffffffffffffd80 >> 0x20);
  local_10 = in_EDX;
  local_c = in_ESI;
  CardinalityInterface::CardinalityInterface(in_RDI);
  in_RDI->_vptr_CardinalityInterface = (_func_int **)&PTR__BetweenCardinalityImpl_0016e590;
  if (local_c < 0) {
    local_21c = 0;
  }
  else {
    local_21c = local_c;
  }
  *(int *)&in_RDI[1]._vptr_CardinalityInterface = local_21c;
  if (local_10 < *(int *)&in_RDI[1]._vptr_CardinalityInterface) {
    local_22c = *(int *)&in_RDI[1]._vptr_CardinalityInterface;
  }
  else {
    local_22c = local_10;
  }
  *(int *)((long)&in_RDI[1]._vptr_CardinalityInterface + 4) = local_22c;
  std::__cxx11::stringstream::stringstream(local_198);
  if (local_c < 0) {
    poVar1 = std::operator<<(local_188,"The invocation lower bound must be >= 0, ");
    poVar1 = std::operator<<(poVar1,"but is actually ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_c);
    std::operator<<(poVar1,".");
    std::__cxx11::stringstream::str();
    internal::Expect((bool)uVar3,in_stack_fffffffffffffd88,iVar2,in_stack_fffffffffffffd78);
    std::__cxx11::string::~string(local_1c8);
  }
  else if (local_10 < 0) {
    poVar1 = std::operator<<(local_188,"The invocation upper bound must be >= 0, ");
    poVar1 = std::operator<<(poVar1,"but is actually ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_10);
    std::operator<<(poVar1,".");
    std::__cxx11::stringstream::str();
    internal::Expect((bool)uVar3,in_stack_fffffffffffffd88,iVar2,in_stack_fffffffffffffd78);
    std::__cxx11::string::~string(local_1e8);
  }
  else if (local_10 < local_c) {
    poVar1 = std::operator<<(local_188,"The invocation upper bound (");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_10);
    file = std::operator<<(poVar1,") must be >= the invocation lower bound (");
    uVar3 = (undefined1)((ulong)poVar1 >> 0x38);
    poVar1 = (ostream *)std::ostream::operator<<(file,local_c);
    std::operator<<(poVar1,").");
    iVar2 = (int)((ulong)poVar1 >> 0x20);
    std::__cxx11::stringstream::str();
    internal::Expect((bool)uVar3,(char *)file,iVar2,in_stack_fffffffffffffd78);
    std::__cxx11::string::~string(local_208);
  }
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

BetweenCardinalityImpl(int min, int max)
      : min_(min >= 0 ? min : 0),
        max_(max >= min_ ? max : min_) {
    std::stringstream ss;
    if (min < 0) {
      ss << "The invocation lower bound must be >= 0, "
         << "but is actually " << min << ".";
      internal::Expect(false, __FILE__, __LINE__, ss.str());
    } else if (max < 0) {
      ss << "The invocation upper bound must be >= 0, "
         << "but is actually " << max << ".";
      internal::Expect(false, __FILE__, __LINE__, ss.str());
    } else if (min > max) {
      ss << "The invocation upper bound (" << max
         << ") must be >= the invocation lower bound (" << min
         << ").";
      internal::Expect(false, __FILE__, __LINE__, ss.str());
    }
  }